

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_create(REF_SUBDIV *ref_subdiv_ptr,REF_GRID ref_grid)

{
  REF_EDGE pRVar1;
  bool bVar2;
  uint uVar3;
  REF_SUBDIV pRVar4;
  REF_INT *pRVar5;
  long lVar6;
  REF_STATUS RVar7;
  char *pcVar8;
  REF_EDGE *ref_edge_ptr;
  
  pRVar4 = (REF_SUBDIV)malloc(0x30);
  *ref_subdiv_ptr = pRVar4;
  if (pRVar4 == (REF_SUBDIV)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x86,
           "ref_subdiv_create","malloc *ref_subdiv_ptr of REF_SUBDIV_STRUCT NULL");
    return 2;
  }
  pRVar4->grid = ref_grid;
  ref_edge_ptr = &pRVar4->edge;
  uVar3 = ref_edge_create(ref_edge_ptr,ref_grid);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x8e,
           "ref_subdiv_create",(ulong)uVar3,"create edge");
    return uVar3;
  }
  pRVar1 = *ref_edge_ptr;
  if ((long)pRVar1->n < 0) {
    RVar7 = 1;
    pcVar8 = "malloc ref_subdiv->mark of REF_INT negative";
LAB_001e5f27:
    bVar2 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x91,
           "ref_subdiv_create",pcVar8);
  }
  else {
    pRVar5 = (REF_INT *)malloc((long)pRVar1->n << 2);
    pRVar4->mark = pRVar5;
    if (pRVar5 == (REF_INT *)0x0) {
      RVar7 = 2;
      pcVar8 = "malloc ref_subdiv->mark of REF_INT NULL";
      goto LAB_001e5f27;
    }
    bVar2 = true;
    RVar7 = 0;
    if (0 < pRVar1->n) {
      lVar6 = 0;
      do {
        pRVar5[lVar6] = 0;
        lVar6 = lVar6 + 1;
      } while (lVar6 < pRVar1->n);
    }
  }
  if (!bVar2) {
    return RVar7;
  }
  pRVar1 = *ref_edge_ptr;
  if ((long)pRVar1->n < 0) {
    RVar7 = 1;
    pcVar8 = "malloc ref_subdiv->node of REF_INT negative";
  }
  else {
    pRVar5 = (REF_INT *)malloc((long)pRVar1->n << 2);
    pRVar4->node = pRVar5;
    if (pRVar5 != (REF_INT *)0x0) {
      bVar2 = true;
      if (0 < pRVar1->n) {
        lVar6 = 0;
        do {
          pRVar5[lVar6] = -1;
          lVar6 = lVar6 + 1;
        } while (lVar6 < pRVar1->n);
      }
      goto LAB_001e5fcc;
    }
    RVar7 = 2;
    pcVar8 = "malloc ref_subdiv->node of REF_INT NULL";
  }
  bVar2 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x93,
         "ref_subdiv_create",pcVar8);
LAB_001e5fcc:
  if (bVar2) {
    pRVar4->allow_geometry = 1;
    pRVar4->new_mark_allowed = 1;
    pRVar4->instrument = 0;
    pRVar4->debug = 0;
    RVar7 = 0;
  }
  return RVar7;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_create(REF_SUBDIV *ref_subdiv_ptr,
                                     REF_GRID ref_grid) {
  REF_SUBDIV ref_subdiv;

  ref_malloc(*ref_subdiv_ptr, 1, REF_SUBDIV_STRUCT);

  ref_subdiv = *ref_subdiv_ptr;

  ref_subdiv_grid(ref_subdiv) = ref_grid;

  RSS(ref_edge_create(&(ref_subdiv_edge(ref_subdiv)),
                      ref_subdiv_grid(ref_subdiv)),
      "create edge");

  ref_malloc_init(ref_subdiv->mark, ref_edge_n(ref_subdiv_edge(ref_subdiv)),
                  REF_INT, 0);
  ref_malloc_init(ref_subdiv->node, ref_edge_n(ref_subdiv_edge(ref_subdiv)),
                  REF_INT, REF_EMPTY);

  ref_subdiv->allow_geometry = REF_TRUE;
  ref_subdiv->new_mark_allowed = REF_TRUE;

  ref_subdiv->instrument = REF_FALSE;
  ref_subdiv->debug = REF_FALSE;

  return REF_SUCCESS;
}